

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

size_t crnd::crnd_msize(void *p)

{
  size_t sVar1;
  
  if (p != (void *)0x0) {
    if (((ulong)p & 7) == 0) {
      sVar1 = (*(code *)g_pMSize)(p,g_pUser_data);
      return sVar1;
    }
    crnd_mem_error("crnd_msize: bad ptr");
  }
  return 0;
}

Assistant:

size_t crnd_msize(void* p)
    {
        if (!p)
            return 0;

        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_msize: bad ptr");
            return 0;
        }

        return (*g_pMSize)(p, g_pUser_data);
    }